

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel.cpp
# Opt level: O3

void __thiscall Pixel_d::print(Pixel_d *this,ostream *os)

{
  undefined8 in_RAX;
  ostream *poVar1;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(os,"Pixel[",6);
  poVar1 = std::ostream::_M_insert<double>(this->x);
  uStack_28 = CONCAT17(0x2c,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  poVar1 = std::ostream::_M_insert<double>(this->y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"](",2);
  poVar1 = std::ostream::_M_insert<double>((this->color).super_Matx<double,_3,_1>.val[0]);
  uStack_28._0_7_ = CONCAT16(0x2c,(undefined6)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 6),1);
  poVar1 = std::ostream::_M_insert<double>((this->color).super_Matx<double,_3,_1>.val[1]);
  uStack_28._0_6_ = CONCAT15(0x2c,(undefined5)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 5),1);
  poVar1 = std::ostream::_M_insert<double>((this->color).super_Matx<double,_3,_1>.val[2]);
  uStack_28._0_5_ = CONCAT14(0x29,(undefined4)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 4),1);
  return;
}

Assistant:

void Pixel_d::print(std::ostream& os) const
{
  os << "Pixel[" << (double)x << ',' << (double)y << "]("
     << color[0] << ','
     << color[1] << ','
     << color[2] << ')';
}